

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.h
# Opt level: O2

bool __thiscall
chrono::fea::ChElementCableANCF::IsSubBlockActive(ChElementCableANCF *this,int nblock)

{
  byte bVar1;
  
  bVar1 = (**(code **)(*(long *)&((this->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[nblock].
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChNodeFEAxyz + 0x18))();
  return (bool)(bVar1 ^ 1);
}

Assistant:

virtual bool IsSubBlockActive(int nblock) const override { return !nodes[nblock]->GetFixed(); }